

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O2

char * zt_os_progpath(void)

{
  uint uVar1;
  char *__buf;
  ssize_t sVar2;
  char path [4097];
  
  __buf = (char *)calloc(1,0x1001);
  if (__buf != (char *)0x0) {
    uVar1 = getpid();
    snprintf(path,0x1000,"/proc/%d/exe",(ulong)uVar1);
    sVar2 = readlink(path,__buf,0x1000);
    if (sVar2 == -1) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"Could not get program path");
    }
  }
  return __buf;
}

Assistant:

char *
zt_os_progpath() {
    char    * result = NULL;

    if ((result = calloc(sizeof(char), PATH_MAX+1)) == NULL) {
        return NULL;
    }

    /*
     * OSX: _NSGetExecutablePath()
     * Solaris: getexecname() or readlink /proc/<pid>/path/a.out
     * Linux: readlink /proc/<pid>/exe
     * FreeBSD:  sysctl CTL_KERN KERN_PROC KERN_PROC_PATHNAME -1
     * BSD w/ Procfs: readlink /proc/curproc/file
     * Windows:  GetModuleFileName() with hModule = NULL
     */
#if defined(__APPLE__)
    {
        uint32_t     size = PATH_MAX;
        _NSGetExecutablePath(result, &size);
    }
#elif defined(WIN32)
	{
		DWORD size = PATH_MAX;
		GetModuleFileName(NULL, result, size);
	}
#else
    if (_proc_get_path(result, PATH_MAX) == -1) {
        zt_log_printf(zt_log_err, "Could not get program path");
    }
#endif
    return result;
}